

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

ComputePipelineStateCreateInfoX * __thiscall
Diligent::ComputePipelineStateCreateInfoX::Clear(ComputePipelineStateCreateInfoX *this)

{
  ComputePipelineStateCreateInfoX CleanDesc;
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  PStack_178;
  
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  ::PipelineStateCreateInfoX(&PStack_178);
  std::swap<Diligent::ComputePipelineStateCreateInfoX>
            (this,(ComputePipelineStateCreateInfoX *)&PStack_178);
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  ::~PipelineStateCreateInfoX(&PStack_178);
  return this;
}

Assistant:

ComputePipelineStateCreateInfoX& Clear()
    {
        ComputePipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }